

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

BasicHeapType __thiscall wasm::HeapType::getBottom(HeapType *this)

{
  uint uVar1;
  Shareability share;
  BasicHeapType BVar2;
  HeapType local_20;
  
  uVar1 = ::wasm::HeapType::getUnsharedBottom();
  local_20.id = (uintptr_t)uVar1;
  share = ::wasm::HeapType::getShared();
  BVar2 = getBasic(&local_20,share);
  return BVar2;
}

Assistant:

BasicHeapType getBottom() const {
    return HeapType(getUnsharedBottom()).getBasic(getShared());
  }